

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre_regex.cpp
# Opt level: O1

void __thiscall booster::regex::data::data(data *this,data *other)

{
  pointer pcVar1;
  size_t sVar2;
  size_t sVar3;
  pcre *ppVar4;
  undefined8 *puVar5;
  
  (this->expression)._M_dataplus._M_p = (pointer)&(this->expression).field_2;
  pcVar1 = (other->expression)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar1,pcVar1 + (other->expression)._M_string_length);
  this->flags = other->flags;
  this->re = (pcre *)0x0;
  this->are = (pcre *)0x0;
  sVar2 = other->re_size;
  sVar3 = other->are_size;
  this->re_size = sVar2;
  this->are_size = sVar3;
  this->match_size = other->match_size;
  if (other->re != (pcre *)0x0) {
    ppVar4 = (pcre *)(*_pcre_malloc)(sVar2);
    this->re = ppVar4;
    if (ppVar4 == (pcre *)0x0) goto LAB_001aaab4;
    memcpy(ppVar4,other->re,this->re_size);
  }
  if (other->are == (pcre *)0x0) {
    return;
  }
  ppVar4 = (pcre *)(*_pcre_malloc)(this->are_size);
  this->are = ppVar4;
  if (ppVar4 != (pcre *)0x0) {
    memcpy(ppVar4,other->are,this->are_size);
    return;
  }
LAB_001aaab4:
  puVar5 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar5 = pthread_rwlock_rdlock;
  __cxa_throw(puVar5,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

data(data const &other) :
			expression(other.expression),
			flags(other.flags),
			re(0),
			are(0),
			re_size(other.re_size),
			are_size(other.are_size),
			match_size(other.match_size)
		{
			try {
				if(other.re!=0) {
					re = (pcre *)(pcre_malloc(re_size));
					if(!re) {
						throw std::bad_alloc();
					}
					memcpy(re,other.re,re_size);
				}
				if(other.are!=0) {
					are = (pcre *)(pcre_malloc(are_size));
					if(!are) {
						throw std::bad_alloc();
					}
					memcpy(are,other.are,are_size);
				}
			}
			catch(...) {
				if(re) pcre_free(re);
				if(are) pcre_free(are);
				throw;
			}
		}